

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

bool wasm::anon_unknown_24::isUninhabitable
               (Type type,
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               *visited,unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *visiting)

{
  bool bVar1;
  bool bVar2;
  HeapType type_00;
  HeapType local_30;
  HeapType local_28;
  Type local_20;
  Type type_local;
  
  if ((type.id & 3) == 0 && 6 < type.id) {
    local_20.id = type.id;
    local_30 = Type::getHeapType(&local_20);
    bVar1 = HeapType::isBottom(&local_30);
    if (bVar1) {
      bVar1 = true;
    }
    else {
      local_28 = Type::getHeapType(&local_20);
      bVar2 = HeapType::isMaybeShared(&local_28,ext);
      bVar1 = true;
      if (!bVar2) {
        type_00 = Type::getHeapType(&local_20);
        bVar1 = isUninhabitable(type_00,visited,visiting);
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isUninhabitable(Type type,
                     std::unordered_set<HeapType>& visited,
                     std::unordered_set<HeapType>& visiting) {
  if (type.isRef() && type.isNonNullable()) {
    if (type.getHeapType().isBottom() ||
        type.getHeapType().isMaybeShared(HeapType::ext)) {
      return true;
    }
    return isUninhabitable(type.getHeapType(), visited, visiting);
  }
  return false;
}